

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

bool __thiscall
absl::container_internal::
btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
::try_merge_or_rebalance
          (btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
           *this,iterator *iter)

{
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  bVar1;
  int iVar2;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *pbVar3;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *this_00;
  bool bVar4;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  bVar5;
  byte bVar6;
  byte bVar7;
  field_type fVar8;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *pbVar9;
  char *__function;
  bool bVar10;
  int iVar11;
  
  pbVar9 = iter->node_;
  if (((ulong)pbVar9 & 7) != 0) {
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *, unsigned int, unsigned char, std::unique_ptr<SeqEntry>, absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *, unsigned int, unsigned char, std::unique_ptr<SeqEntry>, absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 0UL, Char = const char]"
    ;
    goto LAB_00142dc4;
  }
  pbVar3 = *(btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
             **)pbVar9;
  bVar1 = pbVar9[8];
  bVar5 = (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
           )btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
            ::start(pbVar3);
  if ((byte)bVar5 < (byte)bVar1) {
    if ((((ulong)iter->node_ & 7) == 0) &&
       (pbVar9 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                 ::child(pbVar3,(byte)iter->node_[8] - 1), ((ulong)pbVar9 & 7) == 0)) {
      if ((pbVar9[0xb] !=
           (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
            )0x0) &&
         (pbVar9[0xb] !=
          (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
           )0x1e)) {
        __assert_fail("left->max_count() == kNodeSlots",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/btree.h"
                      ,0xa0f,
                      "bool absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>>::try_merge_or_rebalance(iterator *) [Params = absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>]"
                     );
      }
      bVar6 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
              ::count(pbVar9);
      bVar7 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
              ::count(iter->node_);
      if (bVar6 + 1 + (uint)bVar7 < 0x1f) {
        bVar6 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                ::count(pbVar9);
        iter->position_ = bVar6 + 1 + iter->position_;
        pbVar3 = iter->node_;
        btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
        ::merge(pbVar9,pbVar3,(allocator_type *)&this->rightmost_);
        if ((this->rightmost_).
            super_CompressedTupleImpl<absl::container_internal::CompressedTuple<absl::container_internal::key_compare_adapter<compare_ptr,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>::checked_compare,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            .
            super_Storage<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_*,_2UL,_false>
            .value == pbVar3) {
          (this->rightmost_).
          super_CompressedTupleImpl<absl::container_internal::CompressedTuple<absl::container_internal::key_compare_adapter<compare_ptr,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>::checked_compare,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
          .
          super_Storage<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_*,_2UL,_false>
          .value = pbVar9;
        }
        iter->node_ = pbVar9;
        return true;
      }
      goto LAB_00142b4c;
    }
  }
  else {
LAB_00142b4c:
    if ((((ulong)iter->node_ & 7) == 0) && (((ulong)pbVar3 & 7) == 0)) {
      bVar1 = iter->node_[8];
      bVar10 = true;
      if ((byte)bVar1 < (byte)pbVar3[10]) {
        pbVar9 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                 ::child(pbVar3,(byte)bVar1 + 1);
        if (((ulong)pbVar9 & 7) != 0) goto LAB_00142d98;
        if ((pbVar9[0xb] !=
             (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
              )0x0) &&
           (pbVar9[0xb] !=
            (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
             )0x1e)) {
          __assert_fail("right->max_count() == kNodeSlots",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/btree.h"
                        ,0xa1a,
                        "bool absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>>::try_merge_or_rebalance(iterator *) [Params = absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>]"
                       );
        }
        bVar6 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                ::count(iter->node_);
        bVar7 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                ::count(pbVar9);
        if (bVar6 + 1 + (uint)bVar7 < 0x1f) {
          this_00 = iter->node_;
          btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
          ::merge(this_00,pbVar9,(allocator_type *)&this->rightmost_);
          bVar10 = true;
          if ((this->rightmost_).
              super_CompressedTupleImpl<absl::container_internal::CompressedTuple<absl::container_internal::key_compare_adapter<compare_ptr,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>::checked_compare,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
              .
              super_Storage<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_*,_2UL,_false>
              .value == pbVar9) {
            (this->rightmost_).
            super_CompressedTupleImpl<absl::container_internal::CompressedTuple<absl::container_internal::key_compare_adapter<compare_ptr,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>::checked_compare,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            .
            super_Storage<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_*,_2UL,_false>
            .value = this_00;
          }
          bVar4 = false;
        }
        else {
          bVar6 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                  ::count(pbVar9);
          bVar4 = true;
          if (bVar6 < 0x10) {
            bVar10 = true;
          }
          else {
            fVar8 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                    ::count(iter->node_);
            if (fVar8 != '\0') {
              iVar2 = iter->position_;
              bVar6 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                      ::start(iter->node_);
              bVar10 = true;
              if (iVar2 <= (int)(uint)bVar6) goto LAB_00142cbb;
            }
            bVar6 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                    ::count(pbVar9);
            bVar7 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                    ::count(iter->node_);
            iVar11 = (int)((uint)bVar6 - (uint)bVar7) / 2;
            bVar6 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                    ::count(pbVar9);
            iVar2 = bVar6 - 1;
            if (iVar11 <= (int)(bVar6 - 1)) {
              iVar2 = iVar11;
            }
            btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
            ::rebalance_right_to_left(iter->node_,iVar2,pbVar9,(allocator_type *)&this->rightmost_);
            bVar4 = false;
            bVar10 = false;
          }
        }
LAB_00142cbb:
        if (!bVar4) {
          return bVar10;
        }
      }
      if (((ulong)iter->node_ & 7) == 0) {
        bVar1 = iter->node_[8];
        bVar5 = (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                 )btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                  ::start(pbVar3);
        if ((byte)bVar1 <= (byte)bVar5) {
          return false;
        }
        if (((ulong)iter->node_ & 7) == 0) {
          pbVar9 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                   ::child(pbVar3,(byte)iter->node_[8] - 1);
          bVar6 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                  ::count(pbVar9);
          bVar4 = true;
          if (bVar6 < 0x10) goto LAB_00142d80;
          fVar8 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                  ::count(iter->node_);
          if (fVar8 != '\0') {
            if (((ulong)iter->node_ & 7) != 0) goto LAB_00142d98;
            if ((int)(uint)(byte)iter->node_[10] <= iter->position_) goto LAB_00142d80;
          }
          bVar6 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                  ::count(pbVar9);
          bVar7 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                  ::count(iter->node_);
          iVar11 = (int)((uint)bVar6 - (uint)bVar7) / 2;
          bVar6 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                  ::count(pbVar9);
          iVar2 = bVar6 - 1;
          if (iVar11 <= (int)(bVar6 - 1)) {
            iVar2 = iVar11;
          }
          btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
          ::rebalance_left_to_right(pbVar9,iVar2,iter->node_,(allocator_type *)&this->rightmost_);
          iter->position_ = iter->position_ + iVar2;
          bVar4 = false;
          bVar10 = false;
LAB_00142d80:
          if (bVar4) {
            return false;
          }
          return bVar10;
        }
      }
    }
  }
LAB_00142d98:
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *, unsigned int, unsigned char, std::unique_ptr<SeqEntry>, absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *, unsigned int, unsigned char, std::unique_ptr<SeqEntry>, absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
  ;
LAB_00142dc4:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/layout.h"
                ,0x1e3,__function);
}

Assistant:

bool btree<P>::try_merge_or_rebalance(iterator *iter) {
  node_type *parent = iter->node_->parent();
  if (iter->node_->position() > parent->start()) {
    // Try merging with our left sibling.
    node_type *left = parent->child(iter->node_->position() - 1);
    assert(left->max_count() == kNodeSlots);
    if (1U + left->count() + iter->node_->count() <= kNodeSlots) {
      iter->position_ += 1 + left->count();
      merge_nodes(left, iter->node_);
      iter->node_ = left;
      return true;
    }
  }
  if (iter->node_->position() < parent->finish()) {
    // Try merging with our right sibling.
    node_type *right = parent->child(iter->node_->position() + 1);
    assert(right->max_count() == kNodeSlots);
    if (1U + iter->node_->count() + right->count() <= kNodeSlots) {
      merge_nodes(iter->node_, right);
      return true;
    }
    // Try rebalancing with our right sibling. We don't perform rebalancing if
    // we deleted the first element from iter->node_ and the node is not
    // empty. This is a small optimization for the common pattern of deleting
    // from the front of the tree.
    if (right->count() > kMinNodeValues &&
        (iter->node_->count() == 0 || iter->position_ > iter->node_->start())) {
      int to_move = (right->count() - iter->node_->count()) / 2;
      to_move = (std::min)(to_move, right->count() - 1);
      iter->node_->rebalance_right_to_left(to_move, right, mutable_allocator());
      return false;
    }
  }
  if (iter->node_->position() > parent->start()) {
    // Try rebalancing with our left sibling. We don't perform rebalancing if
    // we deleted the last element from iter->node_ and the node is not
    // empty. This is a small optimization for the common pattern of deleting
    // from the back of the tree.
    node_type *left = parent->child(iter->node_->position() - 1);
    if (left->count() > kMinNodeValues &&
        (iter->node_->count() == 0 ||
         iter->position_ < iter->node_->finish())) {
      int to_move = (left->count() - iter->node_->count()) / 2;
      to_move = (std::min)(to_move, left->count() - 1);
      left->rebalance_left_to_right(to_move, iter->node_, mutable_allocator());
      iter->position_ += to_move;
      return false;
    }
  }
  return false;
}